

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O0

void generatePrintMIPSIml(function *fn,string *varName)

{
  bool bVar1;
  tokenCategory tVar2;
  size_type sVar3;
  __cxx11 local_a38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8 [32];
  __cxx11 local_9d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998 [32];
  __cxx11 local_978 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958 [32];
  string local_938 [32];
  function local_918;
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  __cxx11 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  Identifier local_278;
  Identifier local_208;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  __cxx11 local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  __cxx11 local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  int local_b8;
  Reg local_b4;
  int offset;
  __cxx11 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  int local_50;
  int service;
  varType local_3c;
  string local_38 [4];
  varType type;
  string varName1;
  string *varName_local;
  function *fn_local;
  
  getRealName(local_38,(char)varName);
  local_3c = whatIsThisShit(local_38,fn);
  switch(local_3c) {
  case STR_VAR:
    local_50 = 4;
    std::__cxx11::to_string(local_158,4);
    std::operator+((char *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_138);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_198,(ulong)local_38);
    std::operator+((char *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"la $a0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_178);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string(local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
    break;
  case LOCAL_VAR:
  case GLOBAL_VAR:
    if (local_3c == LOCAL_VAR) {
      function::getToken(&local_208,fn,local_38);
      tVar2 = tokenType::getTokenCategory(&local_208.super_tokenType);
      Identifier::~Identifier(&local_208);
      if (tVar2 == INTTK) {
        local_50 = 1;
      }
      else {
        local_50 = 0xb;
      }
    }
    else {
      identityTable::getToken(&local_278,&globalTable,local_38);
      tVar2 = tokenType::getTokenCategory(&local_278.super_tokenType);
      Identifier::~Identifier(&local_278);
      if (tVar2 == INTTK) {
        local_50 = 1;
      }
      else {
        local_50 = 0xb;
      }
    }
    std::__cxx11::to_string(local_2b8,local_50);
    std::operator+((char *)local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_298);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_2b8);
    getValueOfVar(local_2f8,(function *)varName);
    std::operator+((char *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "addu $a0 $0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_2d8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
    break;
  case TEMP_VAR:
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&charTypeTempVar_abi_cxx11_,varName);
    if (sVar3 == 0) {
      local_50 = 1;
    }
    else {
      local_50 = 0xb;
    }
    std::__cxx11::to_string(local_90,local_50);
    std::operator+((char *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_90);
    bVar1 = function::varHasReg(fn,local_38);
    if (bVar1) {
      local_b4 = function::getRegOfVar(fn,local_38,true);
      std::
      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(&reg2str_abi_cxx11_,&local_b4);
      std::operator+((char *)&offset,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "addu $a0 $0 ");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset);
      std::__cxx11::string::~string((string *)&offset);
    }
    else {
      local_b8 = function::getOffsetOfTemp(fn,local_38,true);
      std::__cxx11::to_string(local_118,local_b8);
      std::operator+((char *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"lw $a0 ")
      ;
      std::operator+(local_d8,(char *)local_f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)local_118);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
    break;
  default:
    break;
  case CHARACTER:
    local_50 = 0xb;
    std::operator+((char *)local_9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "addu $a0 $0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_9f8);
    std::__cxx11::string::~string((string *)local_9f8);
    std::__cxx11::to_string(local_a38,local_50);
    std::operator+((char *)local_a18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_a18);
    std::__cxx11::string::~string((string *)local_a18);
    std::__cxx11::string::~string((string *)local_a38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
    break;
  case INTEGER:
    local_50 = 1;
    std::operator+((char *)local_998,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "addu $a0 $0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_998);
    std::__cxx11::string::~string((string *)local_998);
    std::__cxx11::to_string(local_9d8,local_50);
    std::operator+((char *)local_9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_9b8);
    std::__cxx11::string::~string((string *)local_9b8);
    std::__cxx11::string::~string((string *)local_9d8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
    break;
  case RET_VAL:
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_938,(ulong)varName);
    functionTable::getToken(&local_918,&functions,local_938);
    tVar2 = tokenType::getTokenCategory(&local_918.super_tokenType);
    function::~function(&local_918);
    std::__cxx11::string::~string((string *)local_938);
    if (tVar2 == INTTK) {
      local_50 = 1;
    }
    else {
      local_50 = 0xb;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [16])"addu $a0 $0 $v0");
    std::__cxx11::to_string(local_978,local_50);
    std::operator+((char *)local_958,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $v0 ");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,local_958);
    std::__cxx11::string::~string((string *)local_958);
    std::__cxx11::string::~string((string *)local_978);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void generatePrintMIPSIml(function &fn, string &varName) {
    string varName1 = getRealName(varName, '[');
    varType type = whatIsThisShit(varName1, fn);
    int service;
    switch (type) {
        case TEMP_VAR: {
            if (charTypeTempVar.count(varName) != 0)
                service = syscallService[PRINT_CHAR];
            else
                service = syscallService[PRINT_INT];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            if (fn.varHasReg(varName1)) {//寄存器里有值
                mipsCode.emplace_back("addu $a0 $0 " + reg2str.at(fn.getRegOfVar(varName1, true)));
            } else {//栈里有值
                int offset = fn.getOffsetOfTemp(varName1, true);
                mipsCode.emplace_back("lw $a0 " + to_string(offset) + "($sp)");
            }
            mipsCode.emplace_back("syscall");
            break;
        }
        case STR_VAR: {
            service = syscallService[PRINT_STR];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("la $a0 " + varName1.substr(1, varName1.length() - 1));
            mipsCode.emplace_back("syscall");
            break;
        }
        case LOCAL_VAR:
        case GLOBAL_VAR: {
            if (type == LOCAL_VAR) {
                if (fn.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            } else {
                if (globalTable.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            }
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("addu $a0 $0 " + getValueOfVar(varName, fn));
            mipsCode.emplace_back("syscall");
            break;
        }
        case RET_VAL: {
            if (functions.getToken(varName.substr(5, varName.size() - 5)).getTokenCategory() == INTTK)
                service = syscallService[PRINT_INT];
            else
                service = service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 $v0");
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case INTEGER: {
            service = syscallService[PRINT_INT];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case CHARACTER: {
            service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        default:
            break;
    }
}